

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O3

void __thiscall ymfm::ym2203::ym2203(ym2203 *this,ymfm_interface *intf)

{
  this->m_fidelity = OPN_FIDELITY_DEFAULT;
  this->m_address = '\0';
  fm_engine_base<ymfm::opn_registers_base<false>_>::fm_engine_base(&this->m_fm,intf);
  ssg_engine::ssg_engine(&this->m_ssg,intf);
  (this->m_ssg_resampler).m_ssg = &this->m_ssg;
  (this->m_ssg_resampler).m_sampindex = 0;
  (this->m_ssg_resampler).m_resampler =
       (resample_func)ssg_resampler<ymfm::ymfm_output<4>,_1,_false>::resample_nop;
  *(undefined8 *)&(this->m_ssg_resampler).field_0x18 = 0;
  (this->m_ssg_resampler).m_last.data[0] = 0;
  (this->m_ssg_resampler).m_last.data[1] = 0;
  (this->m_ssg_resampler).m_last.data[2] = 0;
  (this->m_last_fm).data[0] = 0;
  update_prescale(this,(this->m_fm).m_clock_prescale);
  return;
}

Assistant:

ym2203::ym2203(ymfm_interface &intf) :
	m_fidelity(OPN_FIDELITY_MAX),
	m_address(0),
	m_fm(intf),
	m_ssg(intf),
	m_ssg_resampler(m_ssg)
{
	m_last_fm.clear();
	update_prescale(m_fm.clock_prescale());
}